

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O3

CurrencyPluralInfo * __thiscall
icu_63::CurrencyPluralInfo::operator=(CurrencyPluralInfo *this,CurrencyPluralInfo *info)

{
  UErrorCode *status;
  UErrorCode UVar1;
  int iVar2;
  int iVar3;
  Hashtable *target;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UErrorCode *pUVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__child_stack;
  Hashtable *source;
  CurrencyPluralInfo *this_00;
  void *in_R8;
  Locale *pLVar4;
  
  if (this == info) {
    return this;
  }
  UVar1 = info->fInternalStatus;
  this->fInternalStatus = UVar1;
  if (U_ZERO_ERROR < UVar1) {
    return this;
  }
  status = &this->fInternalStatus;
  this_00 = this;
  deleteHash(this,this->fPluralCountToCurrencyUnitPattern);
  target = initHash(this_00,status);
  this->fPluralCountToCurrencyUnitPattern = target;
  source = info->fPluralCountToCurrencyUnitPattern;
  pUVar5 = status;
  copyHash(this_00,source,target,status);
  iVar3 = (int)pUVar5;
  if (U_ZERO_ERROR < this->fInternalStatus) {
    return this;
  }
  __child_stack = extraout_RDX;
  if (this->fPluralRules != (PluralRules *)0x0) {
    (*(this->fPluralRules->super_UObject)._vptr_UObject[1])();
    __child_stack = extraout_RDX_00;
  }
  this->fPluralRules = (PluralRules *)0x0;
  if (this->fLocale != (Locale *)0x0) {
    (*(this->fLocale->super_UObject)._vptr_UObject[1])();
    __child_stack = extraout_RDX_01;
  }
  this->fLocale = (Locale *)0x0;
  if (info->fPluralRules != (PluralRules *)0x0) {
    iVar2 = PluralRules::clone(info->fPluralRules,(__fn *)source,__child_stack,iVar3,in_R8);
    this->fPluralRules = (PluralRules *)CONCAT44(extraout_var,iVar2);
    __child_stack = extraout_RDX_02;
    if ((PluralRules *)CONCAT44(extraout_var,iVar2) == (PluralRules *)0x0) goto LAB_00272e4c;
  }
  if (info->fLocale == (Locale *)0x0) {
    return this;
  }
  iVar3 = Locale::clone(info->fLocale,(__fn *)source,__child_stack,iVar3,in_R8);
  pLVar4 = (Locale *)CONCAT44(extraout_var_00,iVar3);
  this->fLocale = pLVar4;
  if (pLVar4 != (Locale *)0x0) {
    if (info->fLocale->fIsBogus != '\0') {
      return this;
    }
    if (pLVar4->fIsBogus == '\0') {
      return this;
    }
  }
LAB_00272e4c:
  *status = U_MEMORY_ALLOCATION_ERROR;
  return this;
}

Assistant:

CurrencyPluralInfo&
CurrencyPluralInfo::operator=(const CurrencyPluralInfo& info) {
    if (this == &info) {
        return *this;
    }

    fInternalStatus = info.fInternalStatus;
    if (U_FAILURE(fInternalStatus)) {
        // bail out early if the object we were copying from was already 'invalid'.
        return *this;
    }

    deleteHash(fPluralCountToCurrencyUnitPattern);
    fPluralCountToCurrencyUnitPattern = initHash(fInternalStatus);
    copyHash(info.fPluralCountToCurrencyUnitPattern, 
             fPluralCountToCurrencyUnitPattern, fInternalStatus);
    if ( U_FAILURE(fInternalStatus) ) {
        return *this;
    }

    delete fPluralRules;
    fPluralRules = nullptr;
    delete fLocale;
    fLocale = nullptr;

    if (info.fPluralRules != nullptr) {
        fPluralRules = info.fPluralRules->clone();
        if (fPluralRules == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
    }
    if (info.fLocale != nullptr) {
        fLocale = info.fLocale->clone();
        if (fLocale == nullptr) {
            // Note: If clone had an error parameter, then we could check/set that instead.
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
        // If the other locale wasn't bogus, but our clone'd locale is bogus, then OOM happened
        // during the call to clone().
        if (!info.fLocale->isBogus() && fLocale->isBogus()) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
    }
    return *this;
}